

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_tga.c
# Opt level: O2

int read_image_tga(gdIOCtx *ctx,oTga *tga)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  size_t size;
  int *piVar5;
  void *buf;
  ulong uVar6;
  void *ptr;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint a;
  int iVar10;
  
  bVar1 = tga->bits;
  iVar3 = overflow2(tga->width,tga->height);
  if (iVar3 != 0) {
    return -1;
  }
  uVar9 = (uint)(bVar1 >> 3);
  iVar3 = overflow2(tga->height * tga->width,uVar9);
  if (iVar3 != 0) {
    return -1;
  }
  a = tga->width * uVar9 * tga->height;
  iVar3 = overflow2(a,4);
  if (iVar3 != 0) {
    return -1;
  }
  if ((tga->imagetype | 8) != 10) {
    return -1;
  }
  size = (size_t)(int)a;
  piVar5 = (int *)gdMalloc(size * 4);
  tga->bitmap = piVar5;
  if (piVar5 == (int *)0x0) {
    return -1;
  }
  if (tga->imagetype == '\n') {
    ptr = gdMalloc(size * 4);
    if (ptr == (void *)0x0) {
      return -1;
    }
    buf = gdMalloc(size);
    if (buf == (void *)0x0) {
      gd_error("gd-tga: premature end of image data\n");
    }
    else {
      uVar4 = gdGetBuf(buf,a,ctx);
      if (0 < (int)uVar4) {
        for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
          *(uint *)((long)ptr + uVar6 * 4) = (uint)*(byte *)((long)buf + uVar6);
        }
        iVar3 = 0;
        uVar6 = 0;
LAB_0011c17a:
        iVar10 = (int)uVar6;
        if ((int)a <= iVar10) goto LAB_0011c2ab;
        if ((int)(iVar3 + uVar9) <= (int)uVar4) {
          uVar2 = *(uint *)((long)ptr + (long)iVar3 * 4);
          if (-1 < (char)uVar2) {
            iVar8 = (uVar2 + 1) * uVar9;
            if ((int)a < iVar8 + iVar10) {
LAB_0011c2b8:
              gdFree(ptr);
              iVar3 = -1;
              goto LAB_0011c29e;
            }
            iVar7 = iVar3 + 1;
            iVar3 = iVar8 + iVar7;
            if ((int)uVar4 < iVar3) goto LAB_0011c2b8;
            memcpy(tga->bitmap + iVar10,(void *)((long)ptr + (long)iVar7 * 4),(long)iVar8 << 2);
            uVar6 = (ulong)(uint)(iVar8 + iVar10);
            goto LAB_0011c17a;
          }
          if ((int)a < (int)(((uVar2 & 0xffffff7f) + 1) * uVar9 + iVar10)) goto LAB_0011c296;
          iVar8 = iVar3 + 1;
          iVar3 = iVar8 + uVar9;
          if (iVar3 <= (int)uVar4) {
            uVar6 = (ulong)iVar10;
            for (iVar10 = 0; iVar10 <= (int)(uVar2 & 0xffffff7f); iVar10 = iVar10 + 1) {
              memcpy(tga->bitmap + uVar6,(void *)((long)ptr + (long)iVar8 * 4),(ulong)(uVar9 * 4));
              uVar6 = uVar6 + (bVar1 >> 3);
            }
            goto LAB_0011c17a;
          }
        }
LAB_0011c296:
        gdFree(ptr);
        goto LAB_0011c29b;
      }
      gdFree(buf);
    }
    iVar3 = -1;
    buf = ptr;
  }
  else {
    if (tga->imagetype != '\x02') {
      return 1;
    }
    buf = gdMalloc(size);
    if (buf == (void *)0x0) {
      return -1;
    }
    uVar9 = gdGetBuf(buf,a,ctx);
    if (uVar9 == a) {
      uVar6 = 0;
      if ((int)a < 1) {
        a = 0;
      }
      iVar3 = 1;
      for (; a != uVar6; uVar6 = uVar6 + 1) {
        tga->bitmap[uVar6] = (uint)*(byte *)((long)buf + uVar6);
      }
    }
    else {
      gd_error("gd-tga: premature end of image data\n");
LAB_0011c29b:
      iVar3 = -1;
    }
  }
LAB_0011c29e:
  gdFree(buf);
  return iVar3;
LAB_0011c2ab:
  gdFree(ptr);
  iVar3 = 1;
  goto LAB_0011c29e;
}

Assistant:

int read_image_tga( gdIOCtx *ctx, oTga *tga )
{
	int pixel_block_size = (tga->bits / 8);
	int image_block_size;
	int* decompression_buffer = NULL;
	unsigned char* conversion_buffer = NULL;
	int buffer_caret = 0;
	int bitmap_caret = 0;
	int i = 0;
	int encoded_pixels;
	int rle_size;

	if(overflow2(tga->width, tga->height)) {
		return -1;
	}

	if(overflow2(tga->width * tga->height, pixel_block_size)) {
		return -1;
	}

	image_block_size = (tga->width * tga->height) * pixel_block_size;
	if(overflow2(image_block_size, sizeof(int))) {
		return -1;
	}

	/*! \todo Add more image type support.
	 */
	if (tga->imagetype != TGA_TYPE_RGB && tga->imagetype != TGA_TYPE_RGB_RLE)
		return -1;

	/*!	\brief Allocate memmory for image block
	 *  Allocate a chunk of memory for the image block to be passed into.
	 */
	tga->bitmap = (int *) gdMalloc(image_block_size * sizeof(int));
	if (tga->bitmap == NULL)
		return -1;

	switch (tga->imagetype) {
	case TGA_TYPE_RGB:
		/*! \brief Read in uncompressed RGB TGA
		 *  Chunk load the pixel data from an uncompressed RGB type TGA.
		 */
		conversion_buffer = (unsigned char *) gdMalloc(image_block_size * sizeof(unsigned char));
		if (conversion_buffer == NULL) {
			return -1;
		}

		if (gdGetBuf(conversion_buffer, image_block_size, ctx) != image_block_size) {
			gd_error("gd-tga: premature end of image data\n");
			gdFree(conversion_buffer);
			return -1;
		}

		while (buffer_caret < image_block_size) {
			tga->bitmap[buffer_caret] = (int) conversion_buffer[buffer_caret];
			buffer_caret++;
		}

		gdFree(conversion_buffer);
		break;

	case TGA_TYPE_RGB_RLE:
		/*! \brief Read in RLE compressed RGB TGA
		 *  Chunk load the pixel data from an RLE compressed RGB type TGA.
		 */
		decompression_buffer = (int*) gdMalloc(image_block_size * sizeof(int));
		if (decompression_buffer == NULL) {
			return -1;
		}
		conversion_buffer = (unsigned char *) gdMalloc(image_block_size * sizeof(unsigned char));
		if (conversion_buffer == NULL) {
			gd_error("gd-tga: premature end of image data\n");
			gdFree( decompression_buffer );
			return -1;
		}

		rle_size = gdGetBuf(conversion_buffer, image_block_size, ctx);
		if (rle_size <= 0) {
			gdFree(conversion_buffer);
			gdFree(decompression_buffer);
			return -1;
		}

		buffer_caret = 0;

		while( buffer_caret < rle_size) {
			decompression_buffer[buffer_caret] = (int)conversion_buffer[buffer_caret];
			buffer_caret++;
		}

		buffer_caret = 0;

		while( bitmap_caret < image_block_size ) {

			if (buffer_caret + pixel_block_size > rle_size) {
				gdFree( decompression_buffer );
				gdFree( conversion_buffer );
				return -1;
			}

			if ((decompression_buffer[buffer_caret] & TGA_RLE_FLAG) == TGA_RLE_FLAG) {
				encoded_pixels = ( ( decompression_buffer[ buffer_caret ] & ~TGA_RLE_FLAG ) + 1 );
				buffer_caret++;

				if ((bitmap_caret + (encoded_pixels * pixel_block_size)) > image_block_size
						|| buffer_caret + pixel_block_size > rle_size) {
					gdFree( decompression_buffer );
					gdFree( conversion_buffer );
					return -1;
				}

				for (i = 0; i < encoded_pixels; i++) {
					memcpy(tga->bitmap + bitmap_caret, decompression_buffer + buffer_caret, pixel_block_size * sizeof(int));
					bitmap_caret += pixel_block_size;
				}
				buffer_caret += pixel_block_size;

			} else {
				encoded_pixels = decompression_buffer[ buffer_caret ] + 1;
				buffer_caret++;

				if ((bitmap_caret + (encoded_pixels * pixel_block_size)) > image_block_size
						|| buffer_caret + (encoded_pixels * pixel_block_size) > rle_size) {
					gdFree( decompression_buffer );
					gdFree( conversion_buffer );
					return -1;
				}

				memcpy(tga->bitmap + bitmap_caret, decompression_buffer + buffer_caret, encoded_pixels * pixel_block_size * sizeof(int));
				bitmap_caret += (encoded_pixels * pixel_block_size);
				buffer_caret += (encoded_pixels * pixel_block_size);
			}
		}
		gdFree( decompression_buffer );
		gdFree( conversion_buffer );
		break;
	}

	return 1;
}